

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O1

int __thiscall soplex::NameSet::remove(NameSet *this,char *__filename)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  int in_EDX;
  char *local_18;
  
  local_18 = this->mem + (this->set).theitem[*(int *)(__filename + 4)].data;
  pcVar4 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::index
                     (&this->hashtab,(char *)&local_18,in_EDX);
  if (-1 < (int)pcVar4) {
    *(states *)
     ((long)((this->hashtab).m_elem.data.
             super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
             ._M_impl.super__Vector_impl_data._M_start + ((ulong)pcVar4 & 0xffffffff)) + 0x10) =
         RELEASED;
    piVar1 = &(this->hashtab).m_used;
    *piVar1 = *piVar1 + -1;
  }
  uVar2 = DataSet<int>::number(&this->set,(DataKey *)__filename);
  iVar3 = DataSet<int>::remove(&this->set,(char *)(ulong)uVar2);
  return iVar3;
}

Assistant:

void NameSet::remove(const DataKey& p_key)
{
   assert(has(p_key));

   hashtab.remove(Name(&mem[set[p_key]]));
   set.remove(p_key);
}